

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O0

void cppwinrt::write_fast_produce_methods(writer *w,TypeDef *default_interface)

{
  bool bVar1;
  pointer ppVar2;
  TypeDef *in_RCX;
  pair<winmd::reader::MethodDef,_winmd::reader::MethodDef> local_e0;
  type *local_c0;
  type *info;
  type *name;
  undefined4 local_a4;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>_>
  local_a0;
  iterator __end1;
  iterator __begin1;
  get_interfaces_t *__range1;
  undefined1 local_50 [16];
  undefined1 local_40 [8];
  vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> bases;
  _Self local_20;
  iterator pair;
  TypeDef *default_interface_local;
  writer *w_local;
  
  if ((settings[0x1d0] & 1) != 0) {
    pair._M_node = (_Base_ptr)default_interface;
    local_20._M_node =
         (_Base_ptr)
         std::
         map<winmd::reader::TypeDef,_winmd::reader::TypeDef,_std::less<winmd::reader::TypeDef>,_std::allocator<std::pair<const_winmd::reader::TypeDef,_winmd::reader::TypeDef>_>_>
         ::find((map<winmd::reader::TypeDef,_winmd::reader::TypeDef,_std::less<winmd::reader::TypeDef>,_std::allocator<std::pair<const_winmd::reader::TypeDef,_winmd::reader::TypeDef>_>_>
                 *)(settings + 0x1d8),default_interface);
    bases.super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  map<winmd::reader::TypeDef,_winmd::reader::TypeDef,_std::less<winmd::reader::TypeDef>,_std::allocator<std::pair<const_winmd::reader::TypeDef,_winmd::reader::TypeDef>_>_>
                  ::end((map<winmd::reader::TypeDef,_winmd::reader::TypeDef,_std::less<winmd::reader::TypeDef>,_std::allocator<std::pair<const_winmd::reader::TypeDef,_winmd::reader::TypeDef>_>_>
                         *)(settings + 0x1d8));
    bVar1 = std::operator==(&local_20,
                            (_Self *)&bases.
                                      super__Vector_base<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_winmd::reader::TypeDef,_winmd::reader::TypeDef>_>::
               operator->(&local_20);
      get_bases((vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)local_40,
                &ppVar2->second);
      std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::rbegin
                ((vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)
                 (local_50 + 8));
      std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::rend
                ((vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)local_50
                );
      ::std::
      for_each<std::reverse_iterator<__gnu_cxx::__normal_iterator<winmd::reader::TypeDef*,std::vector<winmd::reader::TypeDef,std::allocator<winmd::reader::TypeDef>>>>,cppwinrt::write_fast_produce_methods(cppwinrt::writer&,winmd::reader::TypeDef_const&)::__0>
                ((reverse_iterator<__gnu_cxx::__normal_iterator<winmd::reader::TypeDef_*,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>_>
                  *)(local_50 + 8),
                 (reverse_iterator<__gnu_cxx::__normal_iterator<winmd::reader::TypeDef_*,_std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>_>_>
                  *)local_50,(anon_class_8_1_54a39817)w);
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_winmd::reader::TypeDef,_winmd::reader::TypeDef>_>::
               operator->(&local_20);
      get_interfaces_abi_cxx11_
                ((get_interfaces_t *)&__begin1,(cppwinrt *)w,(writer *)&ppVar2->second,in_RCX);
      __end1 = std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
               ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                        *)&__begin1);
      local_a0._M_current =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>
            *)std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
              ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                     *)&__begin1);
      while (bVar1 = __gnu_cxx::operator!=(&__end1,&local_a0), bVar1) {
        name = &__gnu_cxx::
                __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>_>
                ::operator*(&__end1)->first;
        info = (type *)::std::get<0ul,std::__cxx11::string,cppwinrt::interface_info>
                                 ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>
                                   *)name);
        local_c0 = ::std::get<1ul,std::__cxx11::string,cppwinrt::interface_info>
                             ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>
                               *)name);
        if ((local_c0->is_default & 1U) == 0) {
          if ((local_c0->fastabi & 1U) == 0) break;
          winmd::reader::TypeDef::MethodList(&local_e0,&local_c0->type);
          writer_base<cppwinrt::writer>::
          write_each<&cppwinrt::write_produce_method,_std::pair<winmd::reader::MethodDef,_winmd::reader::MethodDef>_>
                    (&w->super_writer_base<cppwinrt::writer>,&local_e0);
        }
        __gnu_cxx::
        __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>_>
        ::operator++(&__end1);
      }
      local_a4 = 2;
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppwinrt::interface_info>_>_>
                 *)&__begin1);
      std::vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_>::~vector
                ((vector<winmd::reader::TypeDef,_std::allocator<winmd::reader::TypeDef>_> *)local_40
                );
    }
  }
  return;
}

Assistant:

static void write_fast_produce_methods(writer& w, TypeDef const& default_interface)
    {
        if (!settings.fastabi)
        {
            return;
        }

        auto pair = settings.fastabi_cache.find(default_interface);

        if (pair == settings.fastabi_cache.end())
        {
            return;
        }

        auto bases = get_bases(pair->second);

        std::for_each(bases.rbegin(), bases.rend(), [&](auto && base)
        {
            auto format = R"(        void* __stdcall base_%() noexcept final
        {
            return this->shim().base_%();
        }
)";

            auto base_name = base.TypeName();
            w.write(format, base_name, base_name);
        });

        for (auto&& [name, info] : get_interfaces(w, pair->second))
        {
            if (info.is_default)
            {
                continue;
            }

            if (!info.fastabi)
            {
                break;
            }

            w.write_each<write_produce_method>(info.type.MethodList());
        }
    }